

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void CopyRow_ERMS(uint8_t *src,uint8_t *dst,int width)

{
  long lVar1;
  
  for (lVar1 = (long)width; lVar1 != 0; lVar1 = lVar1 + -1) {
    *dst = *src;
    src = src + 1;
    dst = dst + 1;
  }
  return;
}

Assistant:

void CopyRow_ERMS(const uint8_t* src, uint8_t* dst, int width) {
  size_t width_tmp = (size_t)(width);
  asm volatile(

      "rep         movsb                         \n"
      : "+S"(src),       // %0
        "+D"(dst),       // %1
        "+c"(width_tmp)  // %2
      :
      : "memory", "cc");
}